

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnConstExpr(Validator *this,ConstExpr *expr)

{
  Type type;
  Result rhs;
  ConstExpr *expr_local;
  Validator *this_local;
  
  type = Const::type(&expr->const_);
  rhs = SharedValidator::OnConst
                  (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)16>).super_Expr.loc,
                   type);
  Result::operator|=(&this->result_,rhs);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnConstExpr(ConstExpr* expr) {
  result_ |= validator_.OnConst(expr->loc, expr->const_.type());
  return Result::Ok;
}